

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O3

VRLocation * __thiscall dg::vr::VRCodeGraph::newVRLocation(VRCodeGraph *this,Instruction *inst)

{
  VRLocation *pVVar1;
  VRLocation *local_30;
  Instruction *local_28;
  
  local_30 = (VRLocation *)(*(long *)&(this->locations).field_0x8 - *(long *)&this->locations >> 3);
  local_28 = inst;
  UniquePtrVector<dg::vr::VRLocation>::emplace_back<unsigned_long>
            (&this->locations,(unsigned_long *)&local_30);
  pVVar1 = *(VRLocation **)(*(long *)&(this->locations).field_0x8 + -8);
  local_30 = pVVar1;
  std::
  _Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>>>
  ::_M_emplace_unique<llvm::Instruction_const*&,dg::vr::VRLocation*>
            ((_Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>>>
              *)&this->locationMapping,&local_28,&local_30);
  return pVVar1;
}

Assistant:

VRLocation &VRCodeGraph::newVRLocation(const llvm::Instruction *inst) {
    assert(locationMapping.find(inst) == locationMapping.end());

    VRLocation &loc = newVRLocation();
    locationMapping.emplace(inst, &loc);
    return loc;
}